

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

PrimitiveTestClass * __thiscall
PrimitiveTestClass::operator=(PrimitiveTestClass *this,PrimitiveTestClass *other)

{
  size_t __n;
  size_t __n_00;
  undefined8 uVar1;
  size_t __n_01;
  unsigned_long uVar2;
  unsigned_long_long uVar3;
  unsigned_short uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uchar *__dest;
  short *__dest_00;
  unsigned_short *__dest_01;
  int *__dest_02;
  uint *__dest_03;
  long *__dest_04;
  unsigned_long *__dest_05;
  longlong *__dest_06;
  unsigned_long_long *__dest_07;
  float *__dest_08;
  double *__dest_09;
  longdouble *__dest_10;
  ulong *puVar11;
  ulong *puVar12;
  ostream *poVar13;
  PrimitiveTestClass *pPVar14;
  ulong __n_02;
  size_t i;
  ulong uVar15;
  long lVar16;
  
  this->c = other->c;
  this->uc = other->uc;
  uVar4 = other->us;
  this->s = other->s;
  this->us = uVar4;
  uVar5 = other->ui;
  this->i = other->i;
  this->ui = uVar5;
  uVar2 = other->ul;
  this->l = other->l;
  this->ul = uVar2;
  uVar3 = other->ull;
  this->ll = other->ll;
  this->ull = uVar3;
  this->f = other->f;
  this->d = other->d;
  this->ld = other->ld;
  pcVar6 = (char *)operator_new__(0xd);
  this->str = pcVar6;
  uVar1 = *(undefined8 *)(other->str + 5);
  *(undefined8 *)pcVar6 = *(undefined8 *)other->str;
  *(undefined8 *)(pcVar6 + 5) = uVar1;
  __n_02 = (ulong)this->SIZE;
  lVar16 = __n_02 * 0x20;
  uVar15 = 0xffffffffffffffff;
  uVar7 = lVar16 + 8;
  if ((long)__n_02 < 0) {
    uVar7 = uVar15;
  }
  sVar8 = __n_02 << 4;
  if ((long)__n_02 < 0) {
    sVar8 = uVar15;
  }
  __n = __n_02 * 8;
  sVar9 = __n;
  if ((long)__n_02 < 0) {
    sVar9 = uVar15;
  }
  __n_00 = __n_02 * 4;
  sVar10 = __n_00;
  if ((long)__n_02 < 0) {
    sVar10 = uVar15;
  }
  __n_01 = __n_02 * 2;
  if (-1 < (long)__n_02) {
    uVar15 = __n_01;
  }
  pcVar6 = (char *)operator_new__(__n_02);
  this->pc = pcVar6;
  memcpy(pcVar6,other->pc,__n_02);
  __dest = (uchar *)operator_new__(__n_02);
  this->puc = __dest;
  memcpy(__dest,other->puc,__n_02);
  __dest_00 = (short *)operator_new__(uVar15);
  this->ps = __dest_00;
  memcpy(__dest_00,other->ps,__n_01);
  __dest_01 = (unsigned_short *)operator_new__(uVar15);
  this->pus = __dest_01;
  memcpy(__dest_01,other->pus,__n_01);
  __dest_02 = (int *)operator_new__(sVar10);
  this->pi = __dest_02;
  memcpy(__dest_02,other->pi,__n_00);
  __dest_03 = (uint *)operator_new__(sVar10);
  this->pui = __dest_03;
  memcpy(__dest_03,other->pui,__n_00);
  __dest_04 = (long *)operator_new__(sVar9);
  this->pl = __dest_04;
  memcpy(__dest_04,other->pl,__n);
  __dest_05 = (unsigned_long *)operator_new__(sVar9);
  this->pul = __dest_05;
  memcpy(__dest_05,other->pul,__n);
  __dest_06 = (longlong *)operator_new__(sVar9);
  this->pll = __dest_06;
  memcpy(__dest_06,other->pll,__n);
  __dest_07 = (unsigned_long_long *)operator_new__(sVar9);
  this->pull = __dest_07;
  memcpy(__dest_07,other->pull,__n);
  __dest_08 = (float *)operator_new__(sVar10);
  this->pf = __dest_08;
  memcpy(__dest_08,other->pf,__n_00);
  __dest_09 = (double *)operator_new__(sVar9);
  this->pd = __dest_09;
  memcpy(__dest_09,other->pd,__n);
  __dest_10 = (longdouble *)operator_new__(sVar8);
  this->pld = __dest_10;
  memcpy(__dest_10,other->pld,__n_02 << 4);
  puVar11 = (ulong *)operator_new__(uVar7);
  *puVar11 = __n_02;
  if (__n_02 != 0) {
    puVar12 = puVar11 + 3;
    do {
      puVar12[-2] = (ulong)puVar12;
      puVar12[-1] = 0;
      *(undefined1 *)puVar12 = 0;
      puVar12 = puVar12 + 4;
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0);
  }
  this->pto = (TestArrObj *)(puVar11 + 1);
  lVar16 = 0;
  for (uVar15 = 0; uVar15 < (ulong)(long)(int)__n_02; uVar15 = uVar15 + 1) {
    std::__cxx11::string::_M_assign((string *)((long)&(this->pto->str)._M_dataplus._M_p + lVar16));
    __n_02 = (ulong)(uint)this->SIZE;
    lVar16 = lVar16 + 0x20;
  }
  std::shared_ptr<int>::operator=(&this->spi,&other->spi);
  pPVar14 = (PrimitiveTestClass *)&this->spto;
  std::shared_ptr<TestArrObj>::operator=((shared_ptr<TestArrObj> *)pPVar14,&other->spto);
  poVar13 = std::operator<<((ostream *)&std::cout,"c: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)pPVar14->c);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"uc: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,(uint)pPVar14->uc);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"s: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,pPVar14->s);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"us: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,pPVar14->us);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"i: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,pPVar14->i);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"ui: ");
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"l: ");
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"ul: ");
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"ll: ");
  poVar13 = std::ostream::_M_insert<long_long>((longlong)poVar13);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"ull: ");
  poVar13 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar13);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"f: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,pPVar14->f);
  std::endl<char,std::char_traits<char>>(poVar13);
  std::operator<<((ostream *)&std::cout,"d: ");
  poVar13 = std::ostream::_M_insert<double>(pPVar14->d);
  std::endl<char,std::char_traits<char>>(poVar13);
  std::operator<<((ostream *)&std::cout,"ld: ");
  poVar13 = std::ostream::_M_insert<long_double>(pPVar14->ld);
  std::endl<char,std::char_traits<char>>(poVar13);
  poVar13 = std::operator<<((ostream *)&std::cout,"str: ");
  poVar13 = std::operator<<(poVar13,pPVar14->str);
  std::endl<char,std::char_traits<char>>(poVar13);
  std::operator<<((ostream *)&std::cout,"pc: ");
  PrintArr<char*>(pPVar14,pPVar14->pc);
  std::operator<<((ostream *)&std::cout,"puc: ");
  PrintArr<unsigned_char*>(pPVar14,pPVar14->puc);
  std::operator<<((ostream *)&std::cout,"ps: ");
  PrintArr<short*>(pPVar14,pPVar14->ps);
  std::operator<<((ostream *)&std::cout,"pus: ");
  PrintArr<unsigned_short*>(pPVar14,pPVar14->pus);
  std::operator<<((ostream *)&std::cout,"pi: ");
  PrintArr<int*>(pPVar14,pPVar14->pi);
  std::operator<<((ostream *)&std::cout,"pui: ");
  PrintArr<unsigned_int*>(pPVar14,pPVar14->pui);
  std::operator<<((ostream *)&std::cout,"pl: ");
  PrintArr<long*>(pPVar14,pPVar14->pl);
  std::operator<<((ostream *)&std::cout,"pul: ");
  PrintArr<unsigned_long*>(pPVar14,pPVar14->pul);
  std::operator<<((ostream *)&std::cout,"pll: ");
  PrintArr<long_long*>(pPVar14,pPVar14->pll);
  std::operator<<((ostream *)&std::cout,"pull: ");
  PrintArr<unsigned_long_long*>(pPVar14,pPVar14->pull);
  std::operator<<((ostream *)&std::cout,"pf: ");
  PrintArr<float*>(pPVar14,pPVar14->pf);
  std::operator<<((ostream *)&std::cout,"pd: ");
  PrintArr<double*>(pPVar14,pPVar14->pd);
  std::operator<<((ostream *)&std::cout,"pld: ");
  PrintArr<long_double*>(pPVar14,pPVar14->pld);
  std::operator<<((ostream *)&std::cout,"pto: ");
  lVar16 = 0;
  for (uVar15 = 0; uVar15 < (ulong)(long)pPVar14->SIZE; uVar15 = uVar15 + 1) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              (string *)((long)&(pPVar14->pto->str)._M_dataplus._M_p + lVar16));
    std::operator<<(poVar13,", ");
    lVar16 = lVar16 + 0x20;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"spi: ");
  for (uVar15 = 0; uVar15 < (ulong)(long)pPVar14->SIZE; uVar15 = uVar15 + 1) {
    poVar13 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,
                         (pPVar14->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         [uVar15]);
    std::operator<<(poVar13,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"spto: ");
  lVar16 = 0;
  for (uVar15 = 0; uVar15 < (ulong)(long)pPVar14->SIZE; uVar15 = uVar15 + 1) {
    poVar13 = std::operator<<((ostream *)&std::cout,
                              (string *)
                              ((long)&(((pPVar14->spto).
                                        super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr)->str)._M_dataplus._M_p + lVar16));
    std::operator<<(poVar13,", ");
    lVar16 = lVar16 + 0x20;
  }
  pPVar14 = (PrimitiveTestClass *)std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return pPVar14;
}

Assistant:

PrimitiveTestClass &operator=(const PrimitiveTestClass &other)
        {
            c = other.c;
            uc = other.uc;
            s = other.s;
            us = other.us;
            i = other.i;
            ui = other.ui;
            l = other.l;
            ul = other.ul;
            ll = other.ll;
            ull = other.ull;
            f = other.f;
            d = other.d;
            ld = other.ld;

            str = new char[strlen("Hello World!") + 1];
            memcpy(str, other.str, strlen("Hello World!") + 1);

            pc = new char[SIZE];
            memcpy(pc, other.pc, SIZE);
            puc = new unsigned char[SIZE];
            memcpy(puc, other.puc, SIZE);
            ps = new short[SIZE];
            memcpy(ps, other.ps, SIZE * sizeof(short));
            pus = new unsigned short[SIZE];
            memcpy(pus, other.pus, SIZE * sizeof(unsigned short));
            pi = new int[SIZE];
            memcpy(pi, other.pi, SIZE * sizeof(int));
            pui = new unsigned int[SIZE];
            memcpy(pui, other.pui, SIZE * sizeof(unsigned int));
            pl = new long[SIZE];
            memcpy(pl, other.pl, SIZE * sizeof(long));
            pul = new unsigned long[SIZE];
            memcpy(pul, other.pul, SIZE * sizeof(unsigned long));
            pll = new long long[SIZE];
            memcpy(pll, other.pll, SIZE * sizeof(long long));
            pull = new unsigned long long[SIZE];
            memcpy(pull, other.pull, SIZE * sizeof(unsigned long long));
            pf = new float[SIZE];
            memcpy(pf, other.pf, SIZE * sizeof(float));
            pd = new double[SIZE];
            memcpy(pd, other.pd, SIZE * sizeof(double));
            pld = new long double[SIZE];
            memcpy(pld, other.pld, SIZE * sizeof(long double));

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i] = other.pto[i];
            }

            spi = other.spi;
            spto = other.spto;
        }